

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sha512_256.c
# Opt level: O0

CURLcode Curl_sha512_256_finish(uchar *digest,void *context)

{
  int iVar1;
  CURLcode CVar2;
  Curl_sha512_256_ctx *ctx;
  CURLcode ret;
  void *context_local;
  uchar *digest_local;
  
  iVar1 = EVP_DigestFinal_ex(*context,digest,(uint *)0x0);
  CVar2 = CURLE_SSL_CIPHER;
  if (iVar1 != 0) {
    CVar2 = CURLE_OK;
  }
  EVP_MD_CTX_free(*context);
  *(undefined8 *)context = 0;
  return CVar2;
}

Assistant:

static CURLcode
Curl_sha512_256_finish(unsigned char *digest,
                       void *context)
{
  CURLcode ret;
  Curl_sha512_256_ctx *const ctx = (Curl_sha512_256_ctx *)context;

#ifdef NEED_NETBSD_SHA512_256_WORKAROUND
  /* Use a larger buffer to work around a bug in NetBSD:
     https://gnats.netbsd.org/cgi-bin/query-pr-single.pl?number=58039 */
  unsigned char tmp_digest[CURL_SHA512_256_DIGEST_SIZE * 2];
  ret = EVP_DigestFinal_ex(*ctx,
                           tmp_digest, NULL) ? CURLE_OK : CURLE_SSL_CIPHER;
  if(ret == CURLE_OK)
    memcpy(digest, tmp_digest, CURL_SHA512_256_DIGEST_SIZE);
  explicit_memset(tmp_digest, 0, sizeof(tmp_digest));
#else  /* ! NEED_NETBSD_SHA512_256_WORKAROUND */
  ret = EVP_DigestFinal_ex(*ctx, digest, NULL) ? CURLE_OK : CURLE_SSL_CIPHER;
#endif /* ! NEED_NETBSD_SHA512_256_WORKAROUND */

  EVP_MD_CTX_destroy(*ctx);
  *ctx = NULL;

  return ret;
}